

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

Expression * __thiscall slang::ast::CoverpointSymbol::getIffExpr(CoverpointSymbol *this)

{
  optional<const_slang::ast::Expression_*> *this_00;
  Scope *scope;
  SyntaxNode *this_01;
  CoverageIffClauseSyntax *pCVar1;
  CoverpointSyntax *pCVar2;
  ExpressionSyntax *pEVar3;
  _Storage<const_slang::ast::Expression_*,_true> _Var4;
  Expression **ppEVar5;
  LookupLocation lookupLocation;
  ASTContext context;
  ASTContext local_60;
  undefined4 extraout_var;
  
  this_00 = &this->iffExpr;
  if ((this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged == false) {
    scope = (this->super_Symbol).parentScope;
    if (scope == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                 ,0x2f0,"const Expression *slang::ast::CoverpointSymbol::getIffExpr() const");
    }
    this_01 = (this->super_Symbol).originatingSyntax;
    if (this_01 == (SyntaxNode *)0x0) {
      (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
      (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
           (Expression *)0x0;
    }
    else {
      pCVar2 = slang::syntax::SyntaxNode::as<slang::syntax::CoverpointSyntax>(this_01);
      pCVar1 = pCVar2->iff;
      if (pCVar1 == (CoverageIffClauseSyntax *)0x0) {
        if ((this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged ==
            false) {
          (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
        }
        (this_00->super__Optional_base<const_slang::ast::Expression_*,_true,_true>)._M_payload.
        super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
             (Expression *)0x0;
      }
      else {
        lookupLocation._12_4_ = 0;
        lookupLocation.scope = (Scope *)0x0;
        lookupLocation.index = 0;
        ASTContext::ASTContext(&local_60,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
        pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pCVar1->expr);
        _Var4._0_4_ = Expression::bind((int)pEVar3,(sockaddr *)&local_60,0x8000000);
        _Var4._4_4_ = extraout_var;
        (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload = _Var4;
        (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
        ppEVar5 = std::optional<const_slang::ast::Expression_*>::value(this_00);
        ASTContext::requireBooleanConvertible(&local_60,*ppEVar5);
      }
    }
  }
  return (this_00->super__Optional_base<const_slang::ast::Expression_*,_true,_true>)._M_payload.
         super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value;
}

Assistant:

const Expression* CoverpointSymbol::getIffExpr() const {
    if (!iffExpr) {
        auto scope = getParentScope();
        auto syntax = getSyntax();
        ASSERT(scope);

        if (!syntax)
            iffExpr = nullptr;
        else {
            auto iffSyntax = syntax->as<CoverpointSyntax>().iff;
            if (!iffSyntax)
                iffExpr = nullptr;
            else {
                ASTContext context(*scope, LookupLocation::min);
                iffExpr = &Expression::bind(*iffSyntax->expr, context,
                                            ASTFlags::AllowCoverageSampleFormal);
                context.requireBooleanConvertible(*iffExpr.value());
            }
        }
    }
    return *iffExpr;
}